

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O1

int mattackm(monst *magr,monst *mdef)

{
  int *piVar1;
  byte bVar2;
  char cVar3;
  permonst *ppVar4;
  permonst *ppVar5;
  boolean bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  obj *poVar11;
  attack *mattk;
  monst *pmVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  int tmp;
  uint uVar19;
  bool bVar20;
  bool bVar21;
  int res [6];
  attack alt_attk;
  char buf [256];
  int local_1bc;
  uint local_1a8 [8];
  permonst *local_188;
  int local_17c;
  permonst *local_178;
  permonst *local_170;
  permonst *local_168;
  permonst *local_160;
  permonst *local_158;
  permonst *local_150;
  permonst *local_148;
  attack local_13c;
  char local_138 [264];
  
  if (mdef == (monst *)0x0 || magr == (monst *)0x0) {
    return 0;
  }
  if ((*(uint *)&magr->field_0x60 & 0xc0000) != 0x40000) {
    return 0;
  }
  local_178 = magr->data;
  ppVar4 = mdef->data;
  if (((local_178 == mons + 0x78) && (magr->mx != mdef->mx)) && (magr->my != mdef->my)) {
    return 0;
  }
  local_1bc = find_mac(mdef);
  local_1bc = (uint)magr->m_lev + local_1bc;
  if ((*(uint *)&mdef->field_0x60 & 0x2c0000) != 0x40000) {
    local_1bc = local_1bc + 4;
    *(uint *)&mdef->field_0x60 = *(uint *)&mdef->field_0x60 & 0xfff7ffff;
  }
  if ((char)*(uint *)&mdef->field_0x60 < '\0') {
    *(uint *)&mdef->field_0x60 = *(uint *)&mdef->field_0x60 & 0xffffff7f;
    newsym((int)mdef->mx,(int)mdef->my);
    if (mdef->wormno == '\0') {
      if (((viz_array[mdef->my][mdef->mx] & 2U) != 0) ||
         (((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
            && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
           ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
          (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
            (((youmonst.data)->mflags3 & 0x100) != 0)) &&
           (((viz_array[mdef->my][mdef->mx] & 1U) != 0 && ((mdef->data->mflags3 & 0x200) != 0)))))))
         ) goto LAB_001c3f52;
    }
    else {
      bVar6 = worm_known(level,mdef);
      if (bVar6 != '\0') {
LAB_001c3f52:
        uVar7 = *(uint *)&mdef->field_0x60;
        if ((((uVar7 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)
           ) {
          if ((uVar7 & 0x280) == 0) goto LAB_001c3fa5;
        }
        else if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c3fa5:
          if (((u._1052_1_ & 0x20) == 0) &&
             (((((mdef->data->mflags1 & 0x10000) != 0 ||
                ((poVar11 = which_armor(mdef,4), poVar11 != (obj *)0x0 &&
                 (poVar11 = which_armor(mdef,4), poVar11->otyp == 0x4f)))) ||
               ((((u.uprops[0x1e].intrinsic == 0 &&
                  (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                   (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                 (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
                  ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
                    (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
                    youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
                (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
                 (iVar8 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), 0x40 < iVar8))))))
              && (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
                  (bVar6 = match_warn_of_mon(mdef), bVar6 == '\0')))))) {
            if (u.usleep == 0) {
              pcVar14 = a_monnam(mdef);
              pcVar15 = "Suddenly, you notice %s.";
            }
            else {
              if ((mdef->data->geno & 0x1000) == 0) {
                pcVar14 = m_monnam(mdef);
                pcVar14 = makeplural(pcVar14);
              }
              else {
                pcVar14 = a_monnam(mdef);
              }
              pcVar15 = "You dream of %s.";
            }
            pline(pcVar15,pcVar14);
          }
        }
      }
    }
  }
  if ((local_178->mflags2 & 0x10) != 0) {
    local_1bc = local_1bc + (uint)((ppVar4->mflags2 >> 7 & 1) != 0);
  }
  bVar20 = false;
  if ((viz_array[magr->my][magr->mx] & 2U) == 0) goto LAB_001c4486;
  if ((viz_array[mdef->my][mdef->mx] & 2U) == 0) {
    bVar20 = false;
    goto LAB_001c4486;
  }
  if ((magr->wormno == '\0') || (bVar6 = worm_known(level,magr), bVar6 != '\0')) {
    uVar7 = *(uint *)&magr->field_0x60;
    if (((uVar7 & 2) == 0) || ((u.uprops[0xc].intrinsic != 0 || (u.uprops[0xc].extrinsic != 0)))) {
      if ((uVar7 & 0x280) == 0) goto LAB_001c3df6;
    }
    else if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c3df6:
      bVar20 = true;
      if ((u._1052_1_ & 0x20) == 0) goto LAB_001c4486;
    }
  }
  if (((magr->data->mflags1 & 0x10000) == 0) &&
     ((poVar11 = which_armor(magr,4), poVar11 == (obj *)0x0 ||
      (poVar11 = which_armor(magr,4), poVar11->otyp != 0x4f)))) {
    if (((u.uprops[0x1e].intrinsic != 0) ||
        (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
         (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
       (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
        ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
          (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
          youmonst.data == mons + 0x32 && (bVar20 = true, u.uprops[0x19].blocked == 0))))))
    goto LAB_001c4486;
    if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
      iVar8 = dist2((int)magr->mx,(int)magr->my,(int)u.ux,(int)u.uy);
      bVar20 = true;
      if (iVar8 < 0x41) goto LAB_001c4486;
    }
  }
  bVar20 = true;
  if (((u.uprops[0x42].intrinsic != 0) || (bVar20 = true, u.uprops[0x42].extrinsic != 0)) ||
     (bVar6 = match_warn_of_mon(magr), bVar6 != '\0')) goto LAB_001c4486;
  if (mdef->wormno == '\0') {
    if (((viz_array[mdef->my][mdef->mx] & 2U) != 0) ||
       (((((u.uprops[0x1e].intrinsic == 0 && ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed))))
          && (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
          (((youmonst.data)->mflags3 & 0x100) != 0)) &&
         (((viz_array[mdef->my][mdef->mx] & 1U) != 0 && ((mdef->data->mflags3 & 0x200) != 0))))))))
    goto LAB_001c42ef;
  }
  else {
    bVar6 = worm_known(level,mdef);
    if (bVar6 != '\0') {
LAB_001c42ef:
      uVar7 = *(uint *)&mdef->field_0x60;
      if ((((uVar7 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar7 & 0x280) == 0) goto LAB_001c4330;
      }
      else if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c4330:
        if ((u._1052_1_ & 0x20) == 0) goto LAB_001c4486;
      }
    }
  }
  if (((((mdef->data->mflags1 & 0x10000) != 0) ||
       ((poVar11 = which_armor(mdef,4), poVar11 != (obj *)0x0 &&
        (poVar11 = which_armor(mdef,4), poVar11->otyp == 0x4f)))) ||
      ((((u.uprops[0x1e].intrinsic == 0 &&
         (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
          (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
        (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
         ((((youmonst.data != mons + 0x31 && youmonst.data != mons + 0x1e) &&
           (u.uprops[0x19].extrinsic == 0 && u.uprops[0x19].intrinsic == 0)) &&
           youmonst.data != mons + 0x32 || (u.uprops[0x19].blocked != 0)))))) &&
       (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
        (iVar8 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), 0x40 < iVar8)))))) &&
     ((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)))) {
    bVar6 = match_warn_of_mon(mdef);
    bVar20 = bVar6 != '\0';
  }
LAB_001c4486:
  vis = bVar20;
  magr->mlstmv = moves;
  local_148 = mons + 0xdb;
  local_150 = mons + 0xd6;
  local_158 = mons + 0xd5;
  local_170 = mons + 0x61;
  local_168 = mons + 0x1e;
  local_160 = mons + 0x127;
  uVar17 = 0;
  local_17c = 0;
  do {
    local_1a8[uVar17] = 0;
    iVar8 = (int)uVar17;
    mattk = getmattk(local_178,iVar8,(int *)local_1a8,&local_13c);
    otmp = (obj *)0x0;
    bVar21 = true;
    bVar20 = false;
    switch(mattk->aatyp) {
    case '\x01':
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\x06':
    case '\x10':
LAB_001c4577:
      iVar9 = distmin((int)magr->mx,(int)magr->my,(int)mdef->mx,(int)mdef->my);
      if (1 < iVar9) {
        return 0;
      }
      if ((((((magr->field_0x62 & 0x20) == 0) && (u.uprops[0x15].intrinsic == 0)) &&
           (u.uprops[0x15].extrinsic == 0)) && (otmp != (obj *)0x0)) &&
         (((ppVar4 = mdef->data, ppVar4 == local_148 &&
           ((mattk->aatyp == 0xfe || ((magr->mintrinsics & 8) == 0)))) ||
          ((mattk->aatyp != 0xfe && (ppVar4 == mons + 0xb || ppVar4 == mons + 0xc))))))
      goto LAB_001c4f73;
      uVar7 = mt_random();
      iVar9 = uVar7 % (iVar8 + 0x14U) + 1;
      iVar8 = local_1bc;
      dieroll = iVar9;
      if (otmp != (obj *)0x0) {
        iVar8 = hitval(otmp,mdef);
        iVar8 = local_1bc - iVar8;
      }
      if (iVar9 < local_1bc) {
        uVar7 = hitmm(magr,mdef,mattk);
        local_1a8[uVar17] = uVar7;
        if (((mdef->data == local_150) || (mdef->data == local_158)) &&
           ((otmp != (obj *)0x0 &&
            ((((*(ushort *)&objects[otmp->otyp].field_0x11 & 0x1f0) == 0xb0 && (1 < mdef->mhp)) &&
             ((mdef->field_0x61 & 1) == 0)))))) {
          pmVar12 = clone_mon(mdef,'\0','\0');
          if ((pmVar12 != (monst *)0x0) && (vis != '\0')) {
            pcVar14 = Monnam(mdef);
            strcpy(local_138,pcVar14);
            pcVar14 = mon_nam(magr);
            pline("%s divides as %s hits it!",local_138,pcVar14);
          }
          bVar21 = false;
          bVar20 = true;
          local_1bc = iVar8;
        }
        else {
          bVar20 = true;
          bVar21 = false;
          local_1bc = iVar8;
        }
      }
      else {
        missmm(magr,mdef,mattk);
        bVar20 = false;
        bVar21 = false;
        local_1bc = iVar8;
      }
      break;
    case '\a':
      if ((uVar17 < 2) || (local_1a8[uVar17 - 1] != 1)) {
        bVar20 = false;
      }
      else {
        bVar20 = local_1a8[uVar17 - 2] == 1;
      }
      if (bVar20 != false) {
        uVar7 = hitmm(magr,mdef,mattk);
        local_1a8[uVar17] = uVar7;
      }
      goto LAB_001c4f75;
    case '\b':
    case '\t':
    case '\n':
    case '\f':
    case '\x0e':
      break;
    case '\v':
      if ((u.usteed == (monst *)0x0 || u.usteed != mdef) &&
         (((u._1052_1_ & 1) == 0 || (u.ustuck != magr)))) {
        uVar7 = mt_random();
        if ((int)(uVar7 % (iVar8 + 0x14U) + 1) < local_1bc) {
          uVar7 = gulpmm(magr,mdef,mattk);
          local_1a8[uVar17] = uVar7;
          bVar20 = true;
          goto LAB_001c4f75;
        }
        missmm(magr,mdef,mattk);
      }
      goto LAB_001c4f73;
    case '\r':
      uVar7 = 0;
      if ((magr->field_0x61 & 1) == 0) {
        if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
          noises(magr,mattk);
        }
        else {
          pcVar14 = Monnam(magr);
          pline("%s explodes!",pcVar14);
        }
        uVar7 = mdamagem(magr,mdef,mattk);
        if ((uVar7 & 4) == 0) {
          mondead(magr);
          if (0 < magr->mhp) goto LAB_001c4a79;
          uVar7 = uVar7 | 4;
        }
        if (magr->mtame != '\0') {
          pline("You have a %s feeling for a moment, then it passes.","melancholy");
        }
      }
LAB_001c4a79:
      local_1a8[uVar17] = uVar7;
      bVar21 = uVar7 == 0;
      bVar20 = !bVar21;
      break;
    case '\x0f':
      if (vis != '\0') {
        pcVar14 = Monnam(magr);
        sprintf(local_138,"%s gazes at",pcVar14);
        pcVar14 = mon_nam(mdef);
        pline("%s %s...",local_138,pcVar14);
      }
      if (((*(uint *)&magr->field_0x60 & 0x20100) != 0x20000) ||
         ((((*(uint *)&magr->field_0x60 & 2) != 0 && ((mdef->data->mflags1 & 0x1000000) == 0)) ||
          ((*(uint *)&mdef->field_0x60 & 0xa0000) != 0x20000)))) {
        if (vis != '\0') {
          uVar7 = 0;
          pline("but nothing happens.");
          goto LAB_001c4f6e;
        }
        goto LAB_001c4f6b;
      }
      if ((magr->data == local_160) && (bVar6 = mon_reflects(mdef,(char *)0x0), bVar6 != '\0')) {
        if (mdef->wormno == '\0') {
          if (((viz_array[mdef->my][mdef->mx] & 2U) != 0) ||
             (((((u.uprops[0x1e].intrinsic == 0 &&
                 ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
              (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                (((youmonst.data)->mflags3 & 0x100) != 0)) &&
               (((viz_array[mdef->my][mdef->mx] & 1U) != 0 && ((mdef->data->mflags3 & 0x200) != 0)))
               ))))) goto LAB_001c4d11;
        }
        else {
          bVar6 = worm_known(level,mdef);
          if (bVar6 != '\0') {
LAB_001c4d11:
            uVar7 = *(uint *)&mdef->field_0x60;
            if ((((uVar7 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar7 & 0x280) == 0) goto LAB_001c4d54;
            }
            else if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c4d54:
              if ((u._1052_1_ & 0x20) == 0) {
                mon_reflects(mdef,"The gaze is reflected away by %s %s.");
              }
            }
          }
        }
        if ((mdef->field_0x62 & 2) == 0) goto LAB_001c48fa;
        bVar6 = mon_reflects(magr,(char *)0x0);
        if (bVar6 == '\0') {
          if (((mdef->field_0x60 & 2) == 0) || ((magr->data->mflags1 & 0x1000000) != 0)) {
            if (magr->wormno == '\0') {
              if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
                 (((((u.uprops[0x1e].intrinsic == 0 &&
                     (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                      (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                    ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                   ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                    (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
                  (((viz_array[magr->my][magr->mx] & 1U) != 0 &&
                   ((magr->data->mflags3 & 0x200) != 0)))))) goto LAB_001c66ed;
            }
            else {
              bVar6 = worm_known(level,magr);
              if (bVar6 != '\0') {
LAB_001c66ed:
                uVar7 = *(uint *)&magr->field_0x60;
                if ((((uVar7 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                   (u.uprops[0xc].extrinsic != 0)) {
                  if ((uVar7 & 0x280) == 0) goto LAB_001c6730;
                }
                else if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c6730:
                  if ((u._1052_1_ & 0x20) == 0) {
                    Monnam(magr);
                    pline("%s is turned to stone!");
                  }
                }
              }
            }
            monstone(magr);
            uVar7 = (uint)(magr->mhp < 1) << 2;
          }
          else {
            if (magr->wormno == '\0') {
              if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001c6848;
              if (((u.uprops[0x1e].intrinsic == 0) &&
                  ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                 (((youmonst.data)->mflags1 & 0x1000) == 0)) {
LAB_001c67f3:
                if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                    (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                   (uVar7 = 0, (viz_array[magr->my][magr->mx] & 1U) != 0)) {
                  if ((magr->data->mflags3 & 0x200) == 0) goto LAB_001c4f6e;
                  goto LAB_001c6848;
                }
              }
              else {
                uVar7 = 0;
                if (ublindf != (obj *)0x0) {
                  if (ublindf->oartifact != '\x1d') goto LAB_001c4f6e;
                  goto LAB_001c67f3;
                }
              }
            }
            else {
              bVar6 = worm_known(level,magr);
              if (bVar6 == '\0') goto LAB_001c4f6b;
LAB_001c6848:
              uVar19 = *(uint *)&magr->field_0x60;
              if ((((uVar19 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar19 & 0x280) != 0) goto LAB_001c4f6b;
              }
              else {
                uVar7 = 0;
                if (((uVar19 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
                goto LAB_001c4f6e;
              }
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar14 = Monnam(magr);
                iVar8 = pronoun_gender(level,magr);
                pline("%s doesn\'t seem to notice that %s gaze was reflected.",pcVar14,
                      genders[iVar8].his);
              }
            }
            uVar7 = 0;
          }
        }
        else if (magr->wormno == '\0') {
          if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
            if ((((u.uprops[0x1e].intrinsic == 0) &&
                 ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
               ((uVar7 = 0, ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
              if ((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                 (((youmonst.data)->mflags3 & 0x100) == 0)) goto LAB_001c4f6b;
              uVar7 = 0;
              if (((viz_array[magr->my][magr->mx] & 1U) != 0) &&
                 ((magr->data->mflags3 & 0x200) != 0)) goto LAB_001c4f1d;
            }
            goto LAB_001c4f6e;
          }
LAB_001c4f1d:
          uVar19 = *(uint *)&magr->field_0x60;
          if ((((uVar19 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar19 & 0x280) != 0) goto LAB_001c4f6b;
          }
          else {
            uVar7 = 0;
            if (((uVar19 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
            goto LAB_001c4f6e;
          }
          uVar7 = 0;
          if ((u._1052_1_ & 0x20) == 0) {
            mon_reflects(magr,"The gaze is reflected away by %s %s.");
          }
        }
        else {
          bVar6 = worm_known(level,magr);
          if (bVar6 != '\0') goto LAB_001c4f1d;
LAB_001c4f6b:
          uVar7 = 0;
        }
      }
      else {
LAB_001c48fa:
        uVar7 = mdamagem(magr,mdef,mattk);
      }
LAB_001c4f6e:
      local_1a8[uVar17] = uVar7;
LAB_001c4f73:
      bVar20 = false;
LAB_001c4f75:
      bVar21 = false;
      break;
    default:
      if (mattk->aatyp == 0xfe) {
        if ((magr->weapon_check == '\x01') || (magr->mw == (obj *)0x0)) {
          magr->weapon_check = '\x03';
          iVar9 = mon_wield_item(magr);
          if (iVar9 != 0) {
            return 0;
          }
        }
        possibly_unwield(magr,'\0');
        poVar11 = magr->mw;
        otmp = poVar11;
        if (poVar11 != (obj *)0x0) {
          if (((vis != '\0') && (flags.verbose != '\0')) &&
             (((u.uprops[0x1e].intrinsic == 0 &&
               (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
              ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))))) {
            uVar7 = *(uint *)&magr->field_0x60;
            if (((uVar7 & 2) == 0) ||
               ((u.uprops[0xc].intrinsic != 0 || (u.uprops[0xc].extrinsic != 0)))) {
              if ((uVar7 & 0x280) == 0) goto LAB_001c4b7f;
            }
            else if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c4b7f:
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar14 = mon_nam(mdef);
                strcpy(local_138,pcVar14);
                pcVar14 = Monnam(magr);
                pcVar15 = "thrusts";
                if ((*(ushort *)&objects[poVar11->otyp].field_0x11 & 4) == 0) {
                  pcVar15 = "swings";
                }
                iVar9 = pronoun_gender(level,magr);
                local_188 = (permonst *)genders[iVar9].his;
                pcVar13 = singular(poVar11,xname);
                pline("%s %s %s %s at %s.",pcVar14,pcVar15,local_188,pcVar13,local_138);
              }
            }
          }
          iVar9 = hitval(otmp,mdef);
          local_1bc = local_1bc + iVar9;
        }
        goto LAB_001c4577;
      }
    }
    if ((!bVar21) && ((local_1a8[uVar17] & 4) == 0)) {
      uVar7 = local_1a8[uVar17] & 2;
      ppVar4 = mdef->data;
      ppVar5 = magr->data;
      lVar16 = 0x13;
LAB_001c4f9f:
      if (*(char *)((long)ppVar4->mattk + lVar16 + -0x13) != '\0') break;
      bVar2 = *(byte *)((long)ppVar4->mattk + lVar16 + -0x11);
      uVar19 = (uint)bVar2;
      local_188 = ppVar5;
      if (bVar2 == 0) {
        bVar2 = *(byte *)((long)&((permonst *)(ppVar4->mattk + -4))->mname + lVar16);
        if (bVar2 == 0) {
          uVar19 = 0;
        }
        else {
          uVar19 = (int)ppVar4->mlevel + 1;
          for (uVar18 = uVar19; uVar18 != 0; uVar18 = uVar18 - 1) {
            uVar10 = mt_random();
            uVar19 = uVar19 + uVar10 % (uint)bVar2;
          }
        }
      }
      else {
        bVar2 = *(byte *)((long)&((permonst *)(ppVar4->mattk + -4))->mname + lVar16);
        uVar18 = uVar19;
        do {
          uVar10 = mt_random();
          uVar19 = uVar19 + uVar10 % (uint)bVar2;
          uVar18 = uVar18 - 1;
        } while (uVar18 != 0);
      }
      cVar3 = *(char *)((long)ppVar4->mattk + lVar16 + -0x12);
      uVar18 = uVar19;
      if (cVar3 == '\x01') {
        bVar6 = resists_magm(magr);
        if (bVar6 != '\0') {
          if (magr->wormno == '\0') {
            if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
               (((((u.uprops[0x1e].intrinsic == 0 &&
                   (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                    (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                  ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                 ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                  (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
                (((viz_array[magr->my][magr->mx] & 1U) != 0 && ((magr->data->mflags3 & 0x200) != 0))
                )))) goto LAB_001c52e0;
          }
          else {
            bVar6 = worm_known(level,magr);
            if (bVar6 != '\0') {
LAB_001c52e0:
              uVar18 = *(uint *)&magr->field_0x60;
              if ((((uVar18 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar18 & 0x280) == 0) goto LAB_001c532f;
              }
              else if (((uVar18 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c532f:
                if ((u._1052_1_ & 0x20) == 0) {
                  shieldeff(magr->mx,magr->my);
                  pcVar14 = mon_nam(magr);
                  pline("A hail of magic missiles narrowly misses %s!",pcVar14);
                }
              }
            }
          }
          goto LAB_001c536b;
        }
        if (magr->wormno == '\0') {
          if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
             (((((u.uprops[0x1e].intrinsic == 0 &&
                 ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
               ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
              (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                (((youmonst.data)->mflags3 & 0x100) != 0)) &&
               (((viz_array[magr->my][magr->mx] & 1U) != 0 && ((magr->data->mflags3 & 0x200) != 0)))
               ))))) {
LAB_001c5617:
            uVar19 = *(uint *)&magr->field_0x60;
            if (((uVar19 & 2) == 0) ||
               ((u.uprops[0xc].intrinsic != 0 || (u.uprops[0xc].extrinsic != 0)))) {
              if ((uVar19 & 0x280) == 0) goto LAB_001c5679;
            }
            else if (((uVar19 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c5679:
              if ((u._1052_1_ & 0x20) == 0) {
                if (magr->data == local_170) {
                  pline("ZOT!");
                }
                else {
                  pcVar14 = Monnam(magr);
                  pline("%s is caught in a hail of magic missiles!",pcVar14);
                }
              }
            }
          }
        }
        else {
          bVar6 = worm_known(level,magr);
          if (bVar6 != '\0') goto LAB_001c5617;
        }
        goto LAB_001c6585;
      }
      if (cVar3 != ')') {
        if (cVar3 != '\b') goto LAB_001c536b;
        if (bVar20 == false) goto LAB_001c6532;
        uVar19 = mt_random();
        if ((uVar19 & 1) == 0) {
          pcVar14 = Monnam(magr);
          strcpy(local_138,pcVar14);
          if (magr->wormno == '\0') {
            if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
               ((((u.uprops[0x1e].intrinsic == 0 &&
                  (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                   (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                 ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                  (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                 (((viz_array[magr->my][magr->mx] & 1U) != 0 && ((magr->data->mflags3 & 0x200) != 0)
                  ))))))) goto LAB_001c57e7;
          }
          else {
            bVar6 = worm_known(level,magr);
            if (bVar6 != '\0') {
LAB_001c57e7:
              uVar19 = *(uint *)&magr->field_0x60;
              if ((((uVar19 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar19 & 0x280) == 0) goto LAB_001c5836;
              }
              else if (((uVar19 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c5836:
                if ((u._1052_1_ & 0x20) == 0) {
                  pcVar14 = mon_nam(mdef);
                  pcVar14 = s_suffix(pcVar14);
                  pline("%s is splashed by %s acid!",local_138,pcVar14);
                }
              }
            }
          }
          if ((magr->mintrinsics & 0x40) == 0) goto LAB_001c6585;
          if (magr->wormno == '\0') {
            if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
               (((((u.uprops[0x1e].intrinsic == 0 &&
                   ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                  (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                 ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                  (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                 (((viz_array[magr->my][magr->mx] & 1U) != 0 && ((magr->data->mflags3 & 0x200) != 0)
                  ))))))) goto LAB_001c5c66;
          }
          else {
            bVar6 = worm_known(level,magr);
            if (bVar6 != '\0') {
LAB_001c5c66:
              uVar19 = *(uint *)&magr->field_0x60;
              if ((((uVar19 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar19 & 0x280) == 0) goto LAB_001c5cc0;
              }
              else if (((uVar19 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c5cc0:
                uVar18 = 0;
                if ((u._1052_1_ & 0x20) != 0) goto LAB_001c6585;
                pcVar14 = Monnam(magr);
                pline("%s is not affected.",pcVar14);
                goto LAB_001c657f;
              }
            }
          }
          goto LAB_001c6532;
        }
LAB_001c657f:
        uVar18 = 0;
        goto LAB_001c6585;
      }
      if ((bVar20 != false) && (otmp != (obj *)0x0 && (mdef->field_0x61 & 1) == 0)) {
        drain_item(otmp);
      }
LAB_001c536b:
      if ((uVar7 == 0) && ((mdef->field_0x61 & 1) == 0)) {
        uVar10 = mt_random();
        uVar18 = 0;
        if (uVar10 * -0x55555555 < 0x55555556) goto LAB_001c6585;
        bVar2 = *(byte *)((long)ppVar4->mattk + lVar16 + -0x12);
        if (bVar2 < 6) {
          if (bVar2 == 2) {
            if ((magr->mintrinsics & 1) == 0) {
              if (magr->wormno == '\0') {
                if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
                   ((((((u.uprops[0x1e].intrinsic == 0 &&
                        ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                       (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                      ((uVar18 = uVar19, ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d'))))
                     && ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                         (uVar18 = uVar19, ((youmonst.data)->mflags3 & 0x100) != 0)))) &&
                    ((uVar18 = uVar19, (viz_array[magr->my][magr->mx] & 1U) != 0 &&
                     ((magr->data->mflags3 & 0x200) != 0)))))) goto LAB_001c61a6;
              }
              else {
                bVar6 = worm_known(level,magr);
                uVar18 = uVar19;
                if (bVar6 != '\0') {
LAB_001c61a6:
                  uVar10 = *(uint *)&magr->field_0x60;
                  if ((((uVar10 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                     (u.uprops[0xc].extrinsic != 0)) {
                    uVar18 = uVar19;
                    if ((uVar10 & 0x280) == 0) goto LAB_001c61fd;
                  }
                  else {
                    uVar18 = uVar19;
                    if (((uVar10 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c61fd:
                      uVar18 = uVar19;
                      if ((u._1052_1_ & 0x20) == 0) {
                        pcVar14 = Monnam(magr);
                        pcVar15 = "%s is suddenly very hot!";
                        goto LAB_001c621c;
                      }
                    }
                  }
                }
              }
              goto LAB_001c6585;
            }
            if (magr->wormno == '\0') {
              if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
                 (((((u.uprops[0x1e].intrinsic == 0 &&
                     ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                    (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                   ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                  (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                    (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                   (((viz_array[magr->my][magr->mx] & 1U) != 0 &&
                    ((magr->data->mflags3 & 0x200) != 0)))))))) goto LAB_001c62a7;
            }
            else {
              bVar6 = worm_known(level,magr);
              if (bVar6 != '\0') {
LAB_001c62a7:
                uVar10 = *(uint *)&magr->field_0x60;
                if ((((uVar10 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                   (u.uprops[0xc].extrinsic != 0)) {
                  uVar18 = 0;
                  if ((uVar10 & 0x280) == 0) {
LAB_001c6313:
                    uVar18 = 0;
                    if ((u._1052_1_ & 0x20) == 0) {
                      pcVar14 = Monnam(magr);
                      pline("%s is mildly warmed.",pcVar14);
                      iVar8 = 2;
                      goto LAB_001c6577;
                    }
                  }
                }
                else {
                  if ((uVar10 & 0x280) != 0) goto LAB_001c6532;
                  uVar18 = 0;
                  if (((youmonst.data)->mflags1 & 0x1000000) != 0) goto LAB_001c6313;
                }
                goto LAB_001c6585;
              }
            }
          }
          else {
            if (bVar2 != 3) goto LAB_001c6585;
            if ((magr->mintrinsics & 2) == 0) {
              if (magr->wormno == '\0') {
                if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
                   (((((u.uprops[0x1e].intrinsic == 0 &&
                       (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                        (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                      ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                     ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                      (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
                    (((viz_array[magr->my][magr->mx] & 1U) != 0 &&
                     ((magr->data->mflags3 & 0x200) != 0)))))) goto LAB_001c63be;
              }
              else {
                bVar6 = worm_known(level,magr);
                if (bVar6 != '\0') {
LAB_001c63be:
                  uVar18 = *(uint *)&magr->field_0x60;
                  if ((((uVar18 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                     (u.uprops[0xc].extrinsic != 0)) {
                    if ((uVar18 & 0x280) == 0) goto LAB_001c640d;
                  }
                  else if (((uVar18 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                  {
LAB_001c640d:
                    if ((u._1052_1_ & 0x20) == 0) {
                      pcVar14 = Monnam(magr);
                      pline("%s is suddenly very cold!",pcVar14);
                    }
                  }
                }
              }
              iVar8 = (int)uVar19 / 2 + mdef->mhp;
              mdef->mhp = iVar8;
              if (mdef->mhpmax < iVar8) {
                mdef->mhpmax = iVar8;
              }
              uVar18 = uVar19;
              if ((int)((uint)mdef->m_lev * 8 + 8) < mdef->mhpmax) {
                split_mon(mdef,magr);
              }
              goto LAB_001c6585;
            }
            if (magr->wormno == '\0') {
              if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
                 (((((u.uprops[0x1e].intrinsic == 0 &&
                     ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                    (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                   ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                  (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                    (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                   (((viz_array[magr->my][magr->mx] & 1U) != 0 &&
                    ((magr->data->mflags3 & 0x200) != 0)))))))) goto LAB_001c64dd;
            }
            else {
              bVar6 = worm_known(level,magr);
              if (bVar6 != '\0') {
LAB_001c64dd:
                uVar10 = *(uint *)&magr->field_0x60;
                if ((((uVar10 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                   (u.uprops[0xc].extrinsic != 0)) {
                  uVar18 = 0;
                  if ((uVar10 & 0x280) == 0) {
LAB_001c6546:
                    uVar18 = 0;
                    if ((u._1052_1_ & 0x20) == 0) {
                      pcVar14 = Monnam(magr);
                      pline("%s is mildly chilly.",pcVar14);
                      iVar8 = 3;
                      goto LAB_001c6577;
                    }
                  }
                }
                else {
                  if ((uVar10 & 0x280) != 0) goto LAB_001c6532;
                  uVar18 = 0;
                  if (((youmonst.data)->mflags1 & 0x1000000) != 0) goto LAB_001c6546;
                }
                goto LAB_001c6585;
              }
            }
          }
          goto LAB_001c6532;
        }
        if (bVar2 == 6) {
          if ((magr->mintrinsics & 0x10) == 0) {
            if (magr->wormno == '\0') {
              if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
                 (((((u.uprops[0x1e].intrinsic == 0 &&
                     ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                    (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                   ((uVar18 = uVar19, ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                  (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                    (uVar18 = uVar19, ((youmonst.data)->mflags3 & 0x100) != 0)) &&
                   ((uVar18 = uVar19, (viz_array[magr->my][magr->mx] & 1U) != 0 &&
                    ((magr->data->mflags3 & 0x200) != 0)))))))) goto LAB_001c5e5e;
            }
            else {
              bVar6 = worm_known(level,magr);
              uVar18 = uVar19;
              if (bVar6 != '\0') {
LAB_001c5e5e:
                uVar10 = *(uint *)&magr->field_0x60;
                if ((((uVar10 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                   (u.uprops[0xc].extrinsic != 0)) {
                  uVar18 = uVar19;
                  if ((uVar10 & 0x280) == 0) goto LAB_001c5ec0;
                }
                else {
                  uVar18 = uVar19;
                  if (((uVar10 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c5ec0:
                    uVar18 = uVar19;
                    if ((u._1052_1_ & 0x20) == 0) {
                      pcVar14 = Monnam(magr);
                      pcVar15 = "%s is jolted with electricity!";
LAB_001c621c:
                      pline(pcVar15,pcVar14);
                      uVar18 = uVar19;
                    }
                  }
                }
              }
            }
          }
          else {
            if (magr->wormno == '\0') {
              if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
                 (((((u.uprops[0x1e].intrinsic == 0 &&
                     ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                    (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                   ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                  (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                    (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                   (((viz_array[magr->my][magr->mx] & 1U) != 0 &&
                    ((magr->data->mflags3 & 0x200) != 0)))))))) goto LAB_001c5f5d;
            }
            else {
              bVar6 = worm_known(level,magr);
              if (bVar6 != '\0') {
LAB_001c5f5d:
                uVar10 = *(uint *)&magr->field_0x60;
                if ((((uVar10 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                   (u.uprops[0xc].extrinsic != 0)) {
                  uVar18 = 0;
                  if ((uVar10 & 0x280) == 0) {
LAB_001c5fc1:
                    uVar18 = 0;
                    if ((u._1052_1_ & 0x20) == 0) {
                      pcVar14 = Monnam(magr);
                      pline("%s is mildly tingled.",pcVar14);
                      iVar8 = 6;
LAB_001c6577:
                      golemeffects(magr,iVar8,uVar19);
                      goto LAB_001c657f;
                    }
                  }
                }
                else {
                  if ((uVar10 & 0x280) != 0) goto LAB_001c6532;
                  uVar18 = 0;
                  if (((youmonst.data)->mflags1 & 0x1000000) != 0) goto LAB_001c5fc1;
                }
                goto LAB_001c6585;
              }
            }
LAB_001c6532:
            uVar18 = 0;
          }
LAB_001c6585:
          piVar1 = &magr->mhp;
          iVar8 = *piVar1;
          *piVar1 = *piVar1 - uVar18;
          if (*piVar1 != 0 && SBORROW4(iVar8,uVar18) == *piVar1 < 0) goto LAB_001c658b;
          monkilled(magr,"",(uint)*(byte *)((long)ppVar4->mattk + lVar16 + -0x12));
          uVar7 = uVar7 + bVar20 + 4;
        }
        else {
          if (bVar2 == 0xc) {
            if ((*(uint *)&magr->field_0x60 >> 0x14 & 1) == 0) {
              *(uint *)&magr->field_0x60 = *(uint *)&magr->field_0x60 | 0x100000;
              if (magr->wormno == '\0') {
                if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
                   (((((u.uprops[0x1e].intrinsic == 0 &&
                       ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                      (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                    (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                      (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                     (((viz_array[magr->my][magr->mx] & 1U) != 0 &&
                      ((magr->data->mflags3 & 0x200) != 0)))))))) goto LAB_001c6070;
              }
              else {
                bVar6 = worm_known(level,magr);
                if (bVar6 != '\0') {
LAB_001c6070:
                  uVar19 = *(uint *)&magr->field_0x60;
                  if ((((uVar19 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                     (u.uprops[0xc].extrinsic != 0)) {
                    uVar18 = 0;
                    if ((uVar19 & 0x280) == 0) {
LAB_001c60dc:
                      uVar18 = 0;
                      if ((u._1052_1_ & 0x20) == 0) {
                        pcVar14 = Monnam(magr);
                        pcVar15 = stagger(magr->data,"stagger");
                        pcVar15 = makeplural(pcVar15);
                        pline("%s %s...",pcVar14,pcVar15);
                        goto LAB_001c657f;
                      }
                    }
                  }
                  else {
                    if ((uVar19 & 0x280) != 0) goto LAB_001c6532;
                    uVar18 = 0;
                    if (((youmonst.data)->mflags1 & 0x1000000) != 0) goto LAB_001c60dc;
                  }
                  goto LAB_001c6585;
                }
              }
              goto LAB_001c6532;
            }
            goto LAB_001c6585;
          }
          if (bVar2 != 0xe) goto LAB_001c6585;
          if (0x7e < (int)uVar19) {
            uVar19 = 0x7f;
          }
          if (ppVar4 == local_168) {
            uVar7 = 1;
            if ((((magr->field_0x62 & 2) != 0) && ((local_188->mflags1 >> 0xc & 1) == 0)) &&
               (((*(uint *)&mdef->field_0x60 >> 0x11 & 1) != 0 &&
                (((local_188->mflags1 >> 0x18 & 1) == 0 &
                 (byte)((*(uint *)&mdef->field_0x60 & 2) >> 1)) == 0)))) {
              pcVar14 = mon_nam(mdef);
              pcVar14 = s_suffix(pcVar14);
              sprintf(local_138,"%s gaze is reflected by %%s %%s.",pcVar14);
              if (magr->wormno == '\0') {
                if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001c698d;
                if (((((u.uprops[0x1e].intrinsic == 0) &&
                      ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                     (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                    ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                   (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                     (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                    ((viz_array[magr->my][magr->mx] & 1U) != 0)))) {
                  pcVar14 = (char *)0x0;
                  if ((magr->data->mflags3 & 0x200) != 0) goto LAB_001c698d;
                }
                else {
LAB_001c6a05:
                  pcVar14 = (char *)0x0;
                }
              }
              else {
                bVar6 = worm_known(level,magr);
                if (bVar6 == '\0') {
LAB_001c69e6:
                  pcVar14 = (char *)0x0;
                }
                else {
LAB_001c698d:
                  uVar7 = *(uint *)&magr->field_0x60;
                  if ((((uVar7 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                     (u.uprops[0xc].extrinsic != 0)) {
                    if ((uVar7 & 0x280) != 0) goto LAB_001c69e6;
                  }
                  else {
                    if ((uVar7 & 0x280) != 0) goto LAB_001c6a05;
                    pcVar14 = (char *)0x0;
                    if (((youmonst.data)->mflags1 & 0x1000000) == 0) goto LAB_001c6a13;
                  }
                  pcVar14 = (char *)0x0;
                  if ((u._1052_1_ & 0x20) == 0) {
                    pcVar14 = local_138;
                  }
                }
              }
LAB_001c6a13:
              bVar6 = mon_reflects(magr,pcVar14);
              if (bVar6 != '\0') goto LAB_001c5de0;
              pcVar14 = Monnam(magr);
              strcpy(local_138,pcVar14);
              if (magr->wormno == '\0') {
                if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
                   ((((((u.uprops[0x1e].intrinsic == 0 &&
                        ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                       (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                      ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                     ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                      (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
                    (((viz_array[magr->my][magr->mx] & 1U) != 0 &&
                     ((magr->data->mflags3 & 0x200) != 0)))))) goto LAB_001c6b30;
              }
              else {
                bVar6 = worm_known(level,magr);
                if (bVar6 != '\0') {
LAB_001c6b30:
                  uVar7 = *(uint *)&magr->field_0x60;
                  if ((((uVar7 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                     (u.uprops[0xc].extrinsic != 0)) {
                    if ((uVar7 & 0x280) == 0) goto LAB_001c6b83;
                  }
                  else if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                  {
LAB_001c6b83:
                    if ((u._1052_1_ & 0x20) == 0) {
                      pcVar14 = mon_nam(mdef);
                      pcVar14 = s_suffix(pcVar14);
                      pline("%s is frozen by %s gaze!",local_138,pcVar14);
                    }
                  }
                }
              }
              magr->field_0x62 = magr->field_0x62 & 0xfb;
              magr->mfrozen = (uchar)uVar19;
              uVar7 = (uint)bVar20;
            }
          }
          else {
            pcVar14 = Monnam(magr);
            strcpy(local_138,pcVar14);
            if (magr->wormno == '\0') {
              if (((viz_array[magr->my][magr->mx] & 2U) != 0) ||
                 (((((u.uprops[0x1e].intrinsic == 0 &&
                     ((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)))) &&
                    (((youmonst.data)->mflags1 & 0x1000) == 0)) ||
                   ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
                  (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0 ||
                    (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                   (((viz_array[magr->my][magr->mx] & 1U) != 0 &&
                    ((magr->data->mflags3 & 0x200) != 0)))))))) goto LAB_001c5d63;
            }
            else {
              bVar6 = worm_known(level,magr);
              if (bVar6 != '\0') {
LAB_001c5d63:
                uVar7 = *(uint *)&magr->field_0x60;
                if ((((uVar7 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                   (u.uprops[0xc].extrinsic != 0)) {
                  if ((uVar7 & 0x280) == 0) goto LAB_001c5da6;
                }
                else if (((uVar7 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001c5da6:
                  if ((u._1052_1_ & 0x20) == 0) {
                    pcVar14 = mon_nam(mdef);
                    pline("%s is frozen by %s.",local_138,pcVar14);
                  }
                }
              }
            }
            magr->field_0x62 = magr->field_0x62 & 0xfb;
            magr->mfrozen = (uchar)uVar19;
LAB_001c5de0:
            uVar7 = (uint)bVar20;
          }
        }
      }
      else {
LAB_001c658b:
        uVar7 = uVar7 | bVar20;
      }
      local_1a8[uVar17] = uVar7;
    }
    uVar7 = local_1a8[uVar17];
    if ((uVar7 & 2) != 0) {
      return uVar7;
    }
    if (bVar20 != false) {
      mdef->field_0x62 = mdef->field_0x62 & 0xf7;
    }
    if ((uVar7 & 4) != 0) {
      return uVar7;
    }
    if ((*(uint *)&magr->field_0x60 & 0xc0000) != 0x40000) {
      return uVar7;
    }
    if ((uVar7 & 1) != 0) {
      local_17c = 1;
    }
    uVar17 = uVar17 + 1;
    if (uVar17 == 6) {
      return (uint)(local_17c != 0);
    }
  } while( true );
  lVar16 = lVar16 + 4;
  if (lVar16 == 0x2b) goto LAB_001c658b;
  goto LAB_001c4f9f;
}

Assistant:

int mattackm(struct monst *magr, struct monst *mdef)
{
    int		    i,		/* loop counter */
		    tmp,	/* amour class difference */
		    strike,	/* hit this attack */
		    attk,	/* attack attempted this time */
		    struck = 0,	/* hit at least once */
		    res[NATTK];	/* results of all attacks */
    const struct attack *mattk;
    struct attack alt_attk;
    const struct permonst *pa, *pd;

    if (!magr || !mdef) return MM_MISS;		/* mike@genat */
    if (!magr->mcanmove || magr->msleeping) return MM_MISS;
    pa = magr->data;
    pd = mdef->data;

    /* Grid bugs cannot attack at an angle. */
    if (pa == &mons[PM_GRID_BUG] && magr->mx != mdef->mx
						&& magr->my != mdef->my)
	return MM_MISS;

    /* Calculate the armour class differential. */
    tmp = find_mac(mdef) + magr->m_lev;
    if (mdef->mconf || !mdef->mcanmove || mdef->msleeping) {
	tmp += 4;
	mdef->msleeping = 0;
    }

    /* undetect monsters become un-hidden if they are attacked */
    if (mdef->mundetected) {
	mdef->mundetected = 0;
	newsym(mdef->mx, mdef->my);
	if (canseemon(level, mdef) && !sensemon(mdef)) {
	    if (u.usleep) pline("You dream of %s.",
				(mdef->data->geno & G_UNIQ) ?
				a_monnam(mdef) : makeplural(m_monnam(mdef)));
	    else pline("Suddenly, you notice %s.", a_monnam(mdef));
	}
    }

    /* Elves hate orcs. */
    if (is_elf(pa) && is_orc(pd)) tmp++;


    /* Set up the visibility of action */
    vis = (cansee(magr->mx,magr->my) && cansee(mdef->mx,mdef->my) && (canspotmon(level, magr) || canspotmon(level, mdef)));

    /*	Set flag indicating monster has moved this turn.  Necessary since a
     *	monster might get an attack out of sequence (i.e. before its move) in
     *	some cases, in which case this still counts as its move for the round
     *	and it shouldn't move again.
     */
    magr->mlstmv = moves;

    /* Now perform all attacks for the monster. */
    for (i = 0; i < NATTK; i++) {
	res[i] = MM_MISS;
	mattk = getmattk(pa, i, res, &alt_attk);
	otmp = NULL;
	attk = 1;
	switch (mattk->aatyp) {
	    case AT_WEAP:		/* "hand to hand" attacks */
		if (magr->weapon_check == NEED_WEAPON || !MON_WEP(magr)) {
		    magr->weapon_check = NEED_HTH_WEAPON;
		    if (mon_wield_item(magr) != 0) return 0;
		}
		possibly_unwield(magr, FALSE);
		otmp = MON_WEP(magr);

		if (otmp) {
		    if (vis) mswingsm(magr, mdef, otmp);
		    tmp += hitval(otmp, mdef);
		}
		/* fall through */
	    case AT_CLAW:
	    case AT_KICK:
	    case AT_BITE:
	    case AT_STNG:
	    case AT_TUCH:
	    case AT_BUTT:
	    case AT_TENT:
		/* Nymph that teleported away on first attack? */
		if (distmin(magr->mx,magr->my,mdef->mx,mdef->my) > 1)
		    return MM_MISS;
		/* Monsters won't attack cockatrices physically if they
		 * have a weapon instead.  They won't attack
		 * disintegrators with a weapon either.  This instinct
		 * doesn't work for players, or under conflict or
		 * confusion.
		 */
		if (!magr->mconf && !Conflict && otmp &&
		    ((touch_disintegrates(mdef->data) &&
		      (mattk->aatyp == AT_WEAP || !resists_disint(magr))) ||
		     (mattk->aatyp != AT_WEAP && touch_petrifies(mdef->data)))) {
		    strike = 0;
		    break;
		}
		dieroll = rnd(20 + i);
		strike = (tmp > dieroll);
		/* KMH -- don't accumulate to-hit bonuses */
		if (otmp)
		    tmp -= hitval(otmp, mdef);
		if (strike) {
		    res[i] = hitmm(magr, mdef, mattk);
		    if ((mdef->data == &mons[PM_BLACK_PUDDING] || mdef->data == &mons[PM_BROWN_PUDDING])
		       && otmp && objects[otmp->otyp].oc_material == IRON
		       && mdef->mhp > 1 && !mdef->mcan)
		    {
			if (clone_mon(mdef, 0, 0)) {
			    if (vis) {
				char buf[BUFSZ];

				strcpy(buf, Monnam(mdef));
				pline("%s divides as %s hits it!", buf, mon_nam(magr));
			    }
			}
		    }
		} else
		    missmm(magr, mdef, mattk);
		break;

	    case AT_HUGS:	/* automatic if prev two attacks succeed */
		strike = (i >= 2 && res[i-1] == MM_HIT && res[i-2] == MM_HIT);
		if (strike)
		    res[i] = hitmm(magr, mdef, mattk);

		break;

	    case AT_GAZE:
		strike = 0;	/* will not wake up a sleeper */
		res[i] = gazemm(magr, mdef, mattk);
		break;

	    case AT_EXPL:
		res[i] = explmm(magr, mdef, mattk);
		if (res[i] == MM_MISS) { /* cancelled--no attack */
		    strike = 0;
		    attk = 0;
		} else
		    strike = 1;	/* automatic hit */
		break;

	    case AT_ENGL:
		if (u.usteed && (mdef == u.usteed)) {
		    strike = 0;
		    break;
		} 
		/* Engulfing attacks are directed at the hero if
		 * possible. -dlc
		 */
		if (u.uswallow && magr == u.ustuck)
		    strike = 0;
		else {
		    if ((strike = (tmp > rnd(20+i))))
			res[i] = gulpmm(magr, mdef, mattk);
		    else
			missmm(magr, mdef, mattk);
		}
		break;

	    default:		/* no attack */
		strike = 0;
		attk = 0;
		break;
	}

	if (attk && !(res[i] & MM_AGR_DIED))
	    res[i] = passivemm(magr, mdef, strike, res[i] & MM_DEF_DIED);

	if (res[i] & MM_DEF_DIED) return res[i];

	/*
	 *  Wake up the defender.  NOTE:  this must follow the check
	 *  to see if the defender died.  We don't want to modify
	 *  unallocated monsters!
	 */
	if (strike) mdef->msleeping = 0;

	if (res[i] & MM_AGR_DIED)  return res[i];
	/* return if aggressor can no longer attack */
	if (!magr->mcanmove || magr->msleeping) return res[i];
	if (res[i] & MM_HIT) struck = 1;	/* at least one hit */
    }

    return struck ? MM_HIT : MM_MISS;
}